

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEditBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIEditBox::sendGuiEvent(CGUIEditBox *this,EGUI_EVENT_TYPE type)

{
  long in_RDI;
  SEvent e;
  undefined4 local_48 [4];
  undefined8 local_38;
  
  if (*(long *)(in_RDI + 0x20) != 0) {
    local_48[0] = 0;
    local_38 = 0;
    (**(code **)(**(long **)(in_RDI + 0x20) + 0x10))(*(long **)(in_RDI + 0x20),local_48);
  }
  return;
}

Assistant:

void CGUIEditBox::sendGuiEvent(EGUI_EVENT_TYPE type)
{
	if (Parent) {
		SEvent e;
		e.EventType = EET_GUI_EVENT;
		e.GUIEvent.Caller = this;
		e.GUIEvent.Element = 0;
		e.GUIEvent.EventType = type;

		Parent->OnEvent(e);
	}
}